

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

int PAL_vswprintf(char16_t *buffer,char16_t *format,__va_list_tag *argptr)

{
  int iVar1;
  LONG Length;
  __va_list_tag *argptr_local;
  char16_t *format_local;
  char16_t *buffer_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = PAL__wvsnprintf(buffer,0x7fffffff,format,argptr);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return iVar1;
}

Assistant:

__attribute__((no_instrument_function))
int
__cdecl
PAL_vswprintf(char16_t *buffer,
              const char16_t *format,
              va_list argptr)
{
    LONG Length;

    PERF_ENTRY(vswprintf);
    ENTRY("PAL_vswprintf (buffer=%p, format=%p (%S), argptr=%p)\n",
          buffer, format, format, argptr);

    Length = PAL__wvsnprintf(buffer, 0x7fffffff, format, argptr);

    LOGEXIT("PAL_vswprintf returns int %d\n", Length);
    PERF_EXIT(vswprintf);

    return Length;
}